

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithBufferSubDataCase::testWithBufferSize
          (ModifyAfterWithBufferSubDataCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *result,int bufferSize)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  deUint64 dVar4;
  deUint64 dVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  
  iVar9 = bufferSize + 3;
  if (-1 < bufferSize) {
    iVar9 = bufferSize;
  }
  iVar2 = (*((this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar7 = (iVar9 >> 2) + 0xf;
  uVar6 = uVar7 & 0xfffffff0;
  iVar9 = bufferSize / 2;
  if (this->m_partialUpload == false) {
    iVar9 = bufferSize;
    uVar6 = 0;
  }
  uVar10 = iVar9 + 0xfU & 0xfffffff0;
  if (this->m_repeatedUpload != false) {
    iVar9 = bufferSize * 3 + 3;
    if (-1 < bufferSize * 3) {
      iVar9 = bufferSize * 3;
    }
    bVar1 = true;
    do {
      bVar8 = bVar1;
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x168))
                (0x8892,(long)(int)uVar6,(long)(int)uVar10,
                 (this->
                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      iVar3 = (*((this->
                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).
                 super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x538))(0,(int)uVar7 >> 4,1);
      (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x538))(0,((iVar9 >> 2) + 0xf >> 4) + -1,1);
      bVar1 = false;
    } while (bVar8);
  }
  dVar4 = deGetMicroseconds();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x168))
            (0x8892,(long)(int)uVar6,(long)(int)uVar10,
             (this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar5 = deGetMicroseconds();
  (result->duration).totalDuration = dVar5 - dVar4;
  (result->duration).fitResponseDuration = dVar5 - dVar4;
  result->writtenSize = uVar10;
  return;
}

Assistant:

void ModifyAfterWithBufferSubDataCase::testWithBufferSize (UploadSampleResult<SingleOperationDuration>& result, int bufferSize)
{
	// always draw the same amount to make compares between cases sensible
	const int					drawStart			= deAlign32(bufferSize / 4, 4*4);
	const int					drawEnd				= deAlign32(bufferSize * 3 / 4, 4*4);

	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const int					subdataOffset		= deAlign32((m_partialUpload) ? (bufferSize / 4) : (0), 4*4);
	const int					subdataSize			= deAlign32((m_partialUpload) ? (bufferSize / 2) : (bufferSize), 4*4);
	deUint64					startTime;
	deUint64					endTime;

	// make upload-draw stream
	if (m_repeatedUpload)
	{
		for (int repeatNdx = 0; repeatNdx < NUM_REPEATS; ++repeatNdx)
		{
			gl.bufferSubData(GL_ARRAY_BUFFER, subdataOffset, subdataSize, &m_zeroData[0]);
			drawBufferRange(drawStart, drawEnd);
		}
	}

	// test upload
	startTime = deGetMicroseconds();
	gl.bufferSubData(GL_ARRAY_BUFFER, subdataOffset, subdataSize, &m_zeroData[0]);
	endTime = deGetMicroseconds();

	result.duration.totalDuration = endTime - startTime;
	result.duration.fitResponseDuration = result.duration.totalDuration;
	result.writtenSize = subdataSize;
}